

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayCopy
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayCopy *curr)

{
  long lVar1;
  size_type __new_size;
  long lVar2;
  Literal *pLVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  undefined1 local_1e0 [8];
  Flow destRef;
  Flow destIndex;
  Flow srcRef;
  Flow srcIndex;
  Flow length;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> copied;
  shared_ptr<wasm::GCData> destData;
  shared_ptr<wasm::GCData> srcData;
  
  visit((Flow *)local_1e0,this,*(Expression **)(curr + 0x10));
  if (destRef.breakTo.super_IString.str._M_len == 0) {
    visit((Flow *)&destRef.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x18));
    if (destIndex.breakTo.super_IString.str._M_len == 0) {
      visit((Flow *)&destIndex.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x20));
      if (srcRef.breakTo.super_IString.str._M_len == 0) {
        visit((Flow *)&srcRef.breakTo.super_IString.str._M_str,this,*(Expression **)(curr + 0x28));
        if (srcIndex.breakTo.super_IString.str._M_len == 0) {
          visit((Flow *)&srcIndex.breakTo.super_IString.str._M_str,this,
                *(Expression **)(curr + 0x30));
          if (length.breakTo.super_IString.str._M_len == 0) {
            Flow::getSingleValue((Flow *)local_1e0);
            ::wasm::Literal::getGCData();
            if (copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
              (*this->_vptr_ExpressionRunner[2])(this,"null ref");
            }
            Flow::getSingleValue((Flow *)&destIndex.breakTo.super_IString.str._M_str);
            ::wasm::Literal::getGCData();
            if (destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              (*this->_vptr_ExpressionRunner[2])(this,"null ref");
            }
            Flow::getSingleValue((Flow *)&destRef.breakTo.super_IString.str._M_str);
            lVar1 = ::wasm::Literal::getUnsigned();
            Flow::getSingleValue((Flow *)&srcRef.breakTo.super_IString.str._M_str);
            srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::wasm::Literal::getUnsigned();
            Flow::getSingleValue((Flow *)&srcIndex.breakTo.super_IString.str._M_str);
            __new_size = ::wasm::Literal::getUnsigned();
            lVar2 = (long)copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage[2].field_0.gcData.
                          super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr -
                    copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage[1].type.id;
            if ((ulong)((long)&(((copied.
                                  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage)->field_0).
                                gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi)->_vptr__Sp_counted_base + lVar2 / 0x18) <
                __new_size + lVar1) {
              (*this->_vptr_ExpressionRunner[2])(this,"oob",lVar2 % 0x18);
            }
            lVar2 = (long)destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[3]._vptr__Sp_counted_base -
                    *(long *)&destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[2]._M_use_count;
            if ((ulong)(lVar2 / 0x18 +
                       *(long *)&(destData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_M_use_count) <
                (long)&(srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_vptr__Sp_counted_base + __new_size) {
              (*this->_vptr_ExpressionRunner[2])(this,"oob",lVar2 % 0x18);
            }
            length.breakTo.super_IString.str._M_str = (char *)0x0;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::resize
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &length.breakTo.super_IString.str._M_str,__new_size);
            lVar2 = (long)srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi * 0x18;
            lVar5 = 0;
            for (p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                -(long)p_Var4 != __new_size;
                p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&p_Var4[-1]._M_weak_count + 3)) {
              pLVar3 = (Literal *)
                       (*(long *)&destData.
                                  super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi[2]._M_use_count + lVar2 + -0x18 + lVar5);
              if (srcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi == p_Var4) {
                pLVar3 = (Literal *)
                         (destData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 1);
              }
              ::wasm::Literal::operator=
                        ((Literal *)(length.breakTo.super_IString.str._M_str + lVar5),pLVar3);
              lVar5 = lVar5 + 0x18;
            }
            lVar2 = 0;
            for (lVar5 = 0; -lVar5 != __new_size; lVar5 = lVar5 + -1) {
              pLVar3 = (Literal *)
                       (copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage[1].type.id +
                        lVar1 * 0x18 + -0x18 + lVar2);
              if (lVar1 == lVar5) {
                pLVar3 = (Literal *)
                         &(copied.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage)->type;
              }
              ::wasm::Literal::operator=
                        (pLVar3,(Literal *)(length.breakTo.super_IString.str._M_str + lVar2));
              lVar2 = lVar2 + 0x18;
            }
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
            .field_0.func.super_IString.str._M_str = (char *)0x0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
            .type.id = 0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
            (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0]
            .field_0.i64 = 0;
            (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
            std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                      ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
                       &length.breakTo.super_IString.str._M_str);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&srcData);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&destData);
          }
          else {
            Flow::Flow(__return_storage_ptr__,(Flow *)&srcIndex.breakTo.super_IString.str._M_str);
          }
          SmallVector<wasm::Literal,_1UL>::~SmallVector
                    ((SmallVector<wasm::Literal,_1UL> *)&srcIndex.breakTo.super_IString.str._M_str);
        }
        else {
          Flow::Flow(__return_storage_ptr__,(Flow *)&srcRef.breakTo.super_IString.str._M_str);
        }
        SmallVector<wasm::Literal,_1UL>::~SmallVector
                  ((SmallVector<wasm::Literal,_1UL> *)&srcRef.breakTo.super_IString.str._M_str);
      }
      else {
        Flow::Flow(__return_storage_ptr__,(Flow *)&destIndex.breakTo.super_IString.str._M_str);
      }
      SmallVector<wasm::Literal,_1UL>::~SmallVector
                ((SmallVector<wasm::Literal,_1UL> *)&destIndex.breakTo.super_IString.str._M_str);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&destRef.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&destRef.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_1e0);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_1e0);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayCopy(ArrayCopy* curr) {
    NOTE_ENTER("ArrayCopy");
    Flow destRef = self()->visit(curr->destRef);
    if (destRef.breaking()) {
      return destRef;
    }
    Flow destIndex = self()->visit(curr->destIndex);
    if (destIndex.breaking()) {
      return destIndex;
    }
    Flow srcRef = self()->visit(curr->srcRef);
    if (srcRef.breaking()) {
      return srcRef;
    }
    Flow srcIndex = self()->visit(curr->srcIndex);
    if (srcIndex.breaking()) {
      return srcIndex;
    }
    Flow length = self()->visit(curr->length);
    if (length.breaking()) {
      return length;
    }
    auto destData = destRef.getSingleValue().getGCData();
    if (!destData) {
      trap("null ref");
    }
    auto srcData = srcRef.getSingleValue().getGCData();
    if (!srcData) {
      trap("null ref");
    }
    size_t destVal = destIndex.getSingleValue().getUnsigned();
    size_t srcVal = srcIndex.getSingleValue().getUnsigned();
    size_t lengthVal = length.getSingleValue().getUnsigned();
    if (destVal + lengthVal > destData->values.size()) {
      trap("oob");
    }
    if (srcVal + lengthVal > srcData->values.size()) {
      trap("oob");
    }
    std::vector<Literal> copied;
    copied.resize(lengthVal);
    for (size_t i = 0; i < lengthVal; i++) {
      copied[i] = srcData->values[srcVal + i];
    }
    for (size_t i = 0; i < lengthVal; i++) {
      destData->values[destVal + i] = copied[i];
    }
    return Flow();
  }